

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O1

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
::add(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
      *this,Key *key)

{
  int iVar1;
  Notifier *pNVar2;
  Container *pCVar3;
  Value *pVVar4;
  int jd;
  int iVar5;
  int iVar6;
  Arc *pAVar7;
  
  iVar1 = key->_id;
  iVar6 = this->capacity;
  if (iVar6 <= iVar1) {
    pNVar2 = (this->super_ObserverBase)._notifier;
    iVar6 = iVar6 + (uint)(iVar6 == 0);
    do {
      iVar5 = iVar6;
      iVar6 = iVar5 * 2;
    } while (iVar5 <= iVar1);
    pAVar7 = __gnu_cxx::new_allocator<lemon::SmartDigraphBase::Arc>::allocate
                       ((new_allocator<lemon::SmartDigraphBase::Arc> *)&this->field_0x28,(long)iVar5
                        ,(void *)0x0);
    pCVar3 = pNVar2->container;
    iVar6 = (int)((ulong)((long)(pCVar3->super_SmartDigraphBase)._nodes.
                                super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar3->super_SmartDigraphBase)._nodes.
                               super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar6 != 0) {
      pVVar4 = this->values;
      do {
        iVar6 = iVar6 + -1;
        if (iVar1 != iVar6) {
          pAVar7[iVar6]._id = pVVar4[iVar6]._id;
        }
      } while (iVar6 != 0);
    }
    if ((long)this->capacity != 0) {
      operator_delete(this->values,(long)this->capacity << 2);
    }
    this->values = pAVar7;
    this->capacity = iVar5;
  }
  return;
}

Assistant:

virtual void build() {
    Notifier* nf = Parent::notifier();
    allocate_memory();
    Item it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }